

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::TSPI_PDU::SetOrientationErrorFlag(TSPI_PDU *this,KBOOL F)

{
  KBOOL F_local;
  TSPI_PDU *this_local;
  
  if (F != (KBOOL)((this->m_TSPIFlagUnion).m_ui8Flag >> 3 & 1)) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag & 0xf7 | F << 3;
    if (F) {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + 6;
    }
    else {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength - 6;
    }
  }
  return;
}

Assistant:

void TSPI_PDU::SetOrientationErrorFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_TSPIFlagUnion.m_ui8OriErr )return;

    m_TSPIFlagUnion.m_ui8OriErr = F;

    if( F )
    {
        m_ui16PDULength += OrientationError::ORIENTATION_ERROR_SIZE;
    }
    else
    {
        m_ui16PDULength -= OrientationError::ORIENTATION_ERROR_SIZE;
    }
}